

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::matchGlobalVars(ClauseMatcher *this,int *resolvedQueryLit)

{
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar1
  ;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar2
  ;
  MatchInfo *bq;
  MatchInfo *pMVar3;
  LitInfo *pLVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  MatchInfo **ppMVar9;
  MatchInfo **ppMVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ILStruct *this_00;
  uint uVar16;
  ILStruct *this_01;
  uint matchIndex;
  ulong side;
  ulong uVar17;
  
  pRVar1 = (this->lms)._cursor;
  pRVar2 = (this->lms)._stack;
  if ((matchGlobalVars(int&)::remaining == '\0') &&
     (iVar8 = __cxa_guard_acquire(&matchGlobalVars(int&)::remaining), iVar8 != 0)) {
    Lib::TriangularArray<int>::TriangularArray(&matchGlobalVars::remaining,10);
    __cxa_atexit(Lib::TriangularArray<int>::~TriangularArray,&matchGlobalVars::remaining,
                 &__dso_handle);
    __cxa_guard_release(&matchGlobalVars(int&)::remaining);
  }
  uVar15 = (int)((ulong)((long)pRVar1 - (long)pRVar2) >> 4) - 1;
  side = (ulong)uVar15;
  Lib::TriangularArray<int>::setSide(&matchGlobalVars::remaining,side);
  piVar5 = matchGlobalVars::remaining._data;
  pRVar1 = (this->lms)._stack;
  for (lVar13 = 0; side * 4 != lVar13; lVar13 = lVar13 + 4) {
    *(undefined4 *)((long)piVar5 + lVar13) =
         *(undefined4 *)
          ((*(ulong *)**(undefined8 **)
                        ((long)&(pRVar1->_self)._M_t.
                                super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                .
                                super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                ._M_head_impl + lVar13 * 4) >> 3) + 0x34);
  }
  if ((matchGlobalVars(int&)::matchIndex == '\0') &&
     (iVar8 = __cxa_guard_acquire(&matchGlobalVars(int&)::matchIndex), iVar8 != 0)) {
    matchGlobalVars::matchIndex._size = 0;
    matchGlobalVars::matchIndex._capacity = 0;
    matchGlobalVars::matchIndex._array = (int *)0x0;
    __cxa_atexit(Lib::DArray<int>::~DArray,&matchGlobalVars::matchIndex,&__dso_handle);
    __cxa_guard_release(&matchGlobalVars(int&)::matchIndex);
  }
  Lib::DArray<int>::ensure(&matchGlobalVars::matchIndex,side);
  uVar12 = 0;
LAB_0026c162:
  uVar11 = (uint)uVar12;
  if (uVar11 < uVar15) {
    uVar17 = uVar12 & 0xffffffff;
    matchGlobalVars::matchIndex._array[uVar17] = -1;
    uVar7 = uVar11 + 1;
    do {
      uVar12 = uVar17 + 1;
      while( true ) {
        uVar16 = matchGlobalVars::matchIndex._array[uVar17] + 1;
        matchGlobalVars::matchIndex._array[uVar17] = uVar16;
        if (uVar16 == *(uint *)((long)matchGlobalVars::remaining._data +
                               uVar17 * 4 +
                               ((matchGlobalVars::remaining._2sideMinus1 - uVar17) * uVar17 &
                               0xfffffffffffffffe) * 2)) break;
        this_01 = (ILStruct *)
                  (**(ulong **)
                     &((this->lms)._stack[uVar17]._self._M_t.
                       super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
                      _M_head_impl)->super_Matcher >> 3);
        ppMVar9 = CodeTree::ILStruct::getMatch(this_01,uVar16);
        bq = *ppMVar9;
        uVar14 = (ulong)uVar7;
        while( true ) {
          if (side <= uVar14) goto LAB_0026c162;
          this_00 = (ILStruct *)
                    (**(ulong **)
                       &((this->lms)._stack[uVar14]._self._M_t.
                         super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                         .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
                        _M_head_impl)->super_Matcher >> 3);
          uVar16 = *(uint *)((long)matchGlobalVars::remaining._data +
                            uVar14 * 4 +
                            ((matchGlobalVars::remaining._2sideMinus1 - uVar17) * uVar17 &
                            0xfffffffffffffffe) * 2);
          matchIndex = 0;
          while (matchIndex < uVar16) {
            ppMVar9 = CodeTree::ILStruct::getMatch(this_00,matchIndex);
            bVar6 = compatible(this,this_01,bq,this_00,*ppMVar9);
            if (bVar6) {
              matchIndex = matchIndex + 1;
            }
            else {
              uVar16 = uVar16 - 1;
              ppMVar9 = CodeTree::ILStruct::getMatch(this_00,matchIndex);
              ppMVar10 = CodeTree::ILStruct::getMatch(this_00,uVar16);
              pMVar3 = *ppMVar9;
              *ppMVar9 = *ppMVar10;
              *ppMVar10 = pMVar3;
            }
          }
          if (uVar16 == 0) break;
          *(uint *)((long)matchGlobalVars::remaining._data +
                   uVar14 * 4 +
                   ((matchGlobalVars::remaining._2sideMinus1 - uVar12) * uVar12 & 0xfffffffffffffffe
                   ) * 2) = uVar16;
          uVar14 = uVar14 + 1;
        }
        if (side <= uVar14) goto LAB_0026c162;
      }
      uVar7 = uVar7 - 1;
      bVar6 = uVar17 != 0;
      uVar17 = uVar17 - 1;
    } while (bVar6);
    goto LAB_0026c376;
  }
  *resolvedQueryLit = -1;
  if (this->sres == true) {
    lVar13 = 0;
    do {
      if (side * 4 == lVar13) goto LAB_0026c376;
      ppMVar9 = CodeTree::ILStruct::getMatch
                          ((ILStruct *)
                           (*(ulong *)**(undefined8 **)
                                        ((long)&(((this->lms)._stack)->_self)._M_t.
                                                super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                                .
                                                super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                                ._M_head_impl + lVar13 * 4) >> 3),
                           *(uint *)((long)matchGlobalVars::matchIndex._array + lVar13));
      pLVar4 = (this->lInfos)._array;
      lVar13 = lVar13 + 4;
    } while (pLVar4[*(uint *)*ppMVar9].opposite != true);
    *resolvedQueryLit = pLVar4[*(uint *)*ppMVar9].litIndex;
  }
LAB_0026c376:
  return uVar15 <= uVar11;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::matchGlobalVars(int& resolvedQueryLit)
{
  //TODO: perform _set_, not _multiset_ subsumption for subsumption resolution

//  bool verbose=query->number()==58746;
//#define VERB_OUT(x) if(verbose) {cout<<x<<endl;}

  unsigned clen=lms.size()-1;

  //remaining[j,0] contains number of matches for j-th index literal
  //remaining[j,i+1] (for j>i) contains number of matches for j-th
  //  index literal compatible with the bindings of i-th literal (and
  //  those before it)
  //remaining[j,j] therefore contains number of matches we have to try
  //  when we get to binding j-th literal
  //  Matches in ILStruct::matches are reordered, so that we always try
  //  the _first_ remaining[j,j] literals
  static TriangularArray<int> remaining(10);
  remaining.setSide(clen);
  for(unsigned j=0;j<clen;j++) {
    ILStruct* ils=lms[j]->getILS();
    remaining.set(j,0,ils->matchCnt);

//    VERB_OUT("matches "<<ils->matches.size()<<" index:"<<j<<" vars:"<<ils->varCnt<<" linfos:"<<lInfos.size());
//    for(unsigned y=0;y<ils->matches.size();y++) {
//      LitInfo* linf=&lInfos[ils->matches[y]->liIndex];
//      VERB_OUT(" match "<<y<<" liIndex:"<<ils->matches[y]->liIndex<<" op: "<<linf->opposite);
//      VERB_OUT(" hdr: "<<(*linf->ft)[0].number());
//    }
//    for(unsigned x=0;x<ils->varCnt;x++) {
//      VERB_OUT(" glob var: "<<ils->sortedGlobalVarNumbers[x]);
//      for(unsigned y=0;y<ils->matches.size();y++) {
//	VERB_OUT(" match "<<y<<" binding: "<<ils->matches[y]->bindings[x]);
//      }
//    }
  }
//  VERB_OUT("secOp:"<<(lms[1]->op-1)->instr()<<" "<<(lms[1]->op-1)->arg());

  static DArray<int> matchIndex;
  matchIndex.ensure(clen);
  unsigned failLev=0;
  for(unsigned i=0;i<clen;i++) {
    matchIndex[i]=-1;
    if(i>0) { failLev=20; }
  bind_next_match:
    matchIndex[i]++;
    if(matchIndex[i]==remaining.get(i,i)) {
      //no more choices at this level, so try going up
      if(i==0) {
	RSTAT_MCTR_INC("zero level fails at", failLev);
	return false;
      }
      i--;
      goto bind_next_match;
    }
    ASS_L(matchIndex[i],remaining.get(i,i));

    ILStruct* bi=lms[i]->getILS(); 		//bound index literal
    MatchInfo* bq=bi->getMatch(matchIndex[i]);	//bound query literal

    //propagate the implications of this binding to next literals
    for(unsigned j=i+1;j<clen;j++) {
      ILStruct* ni=lms[j]->getILS();		//next index literal
      unsigned rem=remaining.get(j,i);
      unsigned k=0;
      while(k<rem) {
	MatchInfo* nq=ni->getMatch(k);		//next query literal
	if(!compatible(bi,bq,ni,nq)) {
	  rem--;
	  swap(ni->getMatch(k),ni->getMatch(rem));
	  continue;
	}
	k++;
      }
      if(rem==0) {
	if(failLev<j) { failLev=j; }
	goto bind_next_match;
      }
      remaining.set(j,i+1,rem);
    }
  }

  resolvedQueryLit=-1;
  if(sres) {
    for(unsigned i=0;i<clen;i++) {
      ILStruct* ils=lms[i]->getILS();
      MatchInfo* mi=ils->getMatch(matchIndex[i]);
      if(lInfos[mi->liIndex].opposite) {
	resolvedQueryLit=lInfos[mi->liIndex].litIndex;
	break;
      }
    }
  }

  return true;
}